

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Player * createInstance<ExampleBot>(string *name)

{
  Player *this;
  string local_30;
  
  this = (Player *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  ExampleBot::ExampleBot((ExampleBot *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

Player *createInstance(std::string name) { return new T{name}; }